

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_CountProximity
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double distance;
  int selector;
  AActor *origin;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  VMValue *pVVar4;
  AActor *pAVar5;
  char *pcVar6;
  bool bVar7;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numret < 1) {
    return 0;
  }
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      origin = (AActor *)(param->field_0).field_1.a;
      if (origin != (AActor *)0x0) {
        if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
          (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (origin->super_DThinker).super_DObject.Class;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar7) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar7 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c6432;
        }
      }
      if (numparam == 1) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          pPVar1 = (PClass *)param[1].field_0.field_1.a;
          if ((pPVar1 != (PClass *)0x0) &&
             (pPVar3 = pPVar1, pPVar1 != AActor::RegistrationInfo.MyClass)) {
            do {
              pPVar3 = pPVar3->ParentClass;
              if (pPVar3 == AActor::RegistrationInfo.MyClass) break;
            } while (pPVar3 != (PClass *)0x0);
            if (pPVar3 == (PClass *)0x0) {
              pcVar6 = "classname == NULL || classname->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_003c648f;
            }
          }
          if (numparam < 3) {
            pcVar6 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              distance = param[2].field_0.f;
              if (numparam == 3) {
                pVVar4 = defaultparam->Array;
                if (defaultparam->Array[3].field_0.field_3.Type != '\0') {
                  pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003c6451:
                  __assert_fail(pcVar6,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x2cc,
                                "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              else {
                pVVar4 = param;
                if (param[3].field_0.field_3.Type != '\0') {
                  pcVar6 = "(param[paramnum]).Type == REGT_INT";
                  goto LAB_003c6451;
                }
              }
              iVar2 = pVVar4[3].field_0.i;
              if (numparam < 5) {
                param = defaultparam->Array;
                if (param[4].field_0.field_3.Type != '\0') {
                  pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_003c6470;
                }
              }
              else if (param[4].field_0.field_3.Type != '\0') {
                pcVar6 = "(param[paramnum]).Type == REGT_INT";
LAB_003c6470:
                __assert_fail(pcVar6,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x2cd,
                              "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              selector = param[4].field_0.i;
              pAVar5 = COPY_AAPTR(origin,selector);
              if (pAVar5 == (AActor *)0x0) {
                iVar2 = 0;
              }
              else {
                iVar2 = P_Thing_CheckProximity(origin,pPVar1,distance,0,iVar2,selector,true);
              }
              if (ret->RegType == '\0') {
                *(int *)ret->Location = iVar2;
                return 1;
              }
              __assert_fail("RegType == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x13f,"void VMReturn::SetInt(int)");
            }
            pcVar6 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x2cb,
                        "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar6 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_003c648f:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x2ca,
                    "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003c6432:
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x2c9,
                "int AF_AActor_CountProximity(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CountProximity)
{
	if (numret > 0)
	{
		PARAM_SELF_PROLOGUE(AActor);
		PARAM_CLASS(classname, AActor);
		PARAM_FLOAT(distance);
		PARAM_INT_DEF(flags);
		PARAM_INT_DEF(ptr);

		AActor *mobj = COPY_AAPTR(self, ptr);
		if (mobj == nullptr)
		{
			ret->SetInt(0);
		}
		else
		{
			ret->SetInt(P_Thing_CheckProximity(self, classname, distance, 0, flags, ptr, true));
		}
		return 1;
	}
	return 0;
}